

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  IfcCompositeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa8,"IfcCompositeProfileDef");
  IfcProfileDef::IfcProfileDef(&this->super_IfcProfileDef,&PTR_construction_vtable_24__00f1f628);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompositeProfileDef,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompositeProfileDef,_2UL> *)
             &(this->super_IfcProfileDef).field_0x58,&PTR_construction_vtable_24__00f1f648);
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xf1f5c0;
  *(undefined8 *)&this->field_0xa8 = 0xf1f610;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x58 = 0xf1f5e8;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_2UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_2UL,_0UL> *)
             &(this->super_IfcProfileDef).field_0x68);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Label);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}